

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputFlateDecodeTester.cpp
# Opt level: O0

int InputFlateDecodeTester(int argc,char **argv)

{
  bool bVar1;
  IByteWriterWithPosition *inWriter;
  Byte *inBuffer;
  LongBufferSizeType LVar2;
  IByteReader *inSourceReader;
  ostream *poVar3;
  reference pcVar4;
  byte local_1f9;
  LongBufferSizeType amountRead;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  iterator it;
  int i;
  bool isSame;
  string local_168;
  undefined1 local_148 [8];
  InputFile inputFile;
  string local_110;
  string local_f0;
  undefined1 local_d0 [8];
  OutputFlateEncodeStream outputEncoder;
  InputFlateDecodeStream inputDecoder;
  Byte buffer;
  allocator<char> local_69;
  string local_68 [8];
  string aString;
  OutputFile outputFile;
  char **argv_local;
  int argc_local;
  
  OutputFile::OutputFile((OutputFile *)((long)&aString.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"hello world",&local_69);
  std::allocator<char>::~allocator(&local_69);
  InputFlateDecodeStream::InputFlateDecodeStream
            ((InputFlateDecodeStream *)&outputEncoder.mZLibState);
  OutputFlateEncodeStream::OutputFlateEncodeStream((OutputFlateEncodeStream *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"source.txt",(allocator<char> *)((long)&inputFile.mFileStream + 7)
            );
  BuildRelativeOutputPath(&local_f0,argv,&local_110);
  OutputFile::OpenFile((OutputFile *)((long)&aString.field_2 + 8),&local_f0,false);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)((long)&inputFile.mFileStream + 7));
  inWriter = OutputFile::GetOutputStream((OutputFile *)((long)&aString.field_2 + 8));
  OutputFlateEncodeStream::Assign((OutputFlateEncodeStream *)local_d0,inWriter,true);
  inBuffer = (Byte *)std::__cxx11::string::c_str();
  LVar2 = std::__cxx11::string::size();
  OutputFlateEncodeStream::Write((OutputFlateEncodeStream *)local_d0,inBuffer,LVar2);
  OutputFlateEncodeStream::Assign
            ((OutputFlateEncodeStream *)local_d0,(IByteWriterWithPosition *)0x0,true);
  OutputFile::CloseFile((OutputFile *)((long)&aString.field_2 + 8));
  InputFile::InputFile((InputFile *)local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,"source.txt",(allocator<char> *)((long)&it._M_current + 7));
  BuildRelativeOutputPath(&local_168,argv,(string *)&i);
  InputFile::OpenFile((InputFile *)local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  inSourceReader = &InputFile::GetInputStream((InputFile *)local_148)->super_IByteReader;
  InputFlateDecodeStream::Assign((InputFlateDecodeStream *)&outputEncoder.mZLibState,inSourceReader)
  ;
  it._M_current._6_1_ = 1;
  it._M_current._0_4_ = 0;
  local_198._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    amountRead = std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=
                      (&local_198,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&amountRead);
    local_1f9 = 0;
    if (bVar1) {
      local_1f9 = it._M_current._6_1_;
    }
    if ((local_1f9 & 1) == 0) goto LAB_001522d0;
    LVar2 = InputFlateDecodeStream::Read
                      ((InputFlateDecodeStream *)&outputEncoder.mZLibState,&inputDecoder.field_0x23,
                       1);
    if (LVar2 != 1) break;
    pcVar4 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_198);
    it._M_current._6_1_ = (int)*pcVar4 == (uint)(byte)inputDecoder._35_1_;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_198);
    it._M_current._0_4_ = (int)it._M_current + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Read failes. expected ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  poVar3 = std::operator<<(poVar3," characters. Found");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,LVar2);
  std::operator<<(poVar3,"\n");
  it._M_current._6_1_ = 0;
LAB_001522d0:
  InputFlateDecodeStream::Assign
            ((InputFlateDecodeStream *)&outputEncoder.mZLibState,(IByteReader *)0x0);
  InputFile::CloseFile((InputFile *)local_148);
  bVar1 = (it._M_current._6_1_ & 1) == 0;
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"Read failes. different characters than what expected\n");
  }
  argv_local._4_4_ = (uint)bVar1;
  InputFile::~InputFile((InputFile *)local_148);
  OutputFlateEncodeStream::~OutputFlateEncodeStream((OutputFlateEncodeStream *)local_d0);
  InputFlateDecodeStream::~InputFlateDecodeStream
            ((InputFlateDecodeStream *)&outputEncoder.mZLibState);
  std::__cxx11::string::~string(local_68);
  OutputFile::~OutputFile((OutputFile *)((long)&aString.field_2 + 8));
  return argv_local._4_4_;
}

Assistant:

int InputFlateDecodeTester(int argc, char* argv[])
{
	OutputFile outputFile;
	string aString("hello world");
	IOBasicTypes::Byte buffer;
	InputFlateDecodeStream inputDecoder;
	OutputFlateEncodeStream outputEncoder;

	outputFile.OpenFile(BuildRelativeOutputPath(argv,"source.txt"));
	outputEncoder.Assign(outputFile.GetOutputStream());
	outputEncoder.Write((IOBasicTypes::Byte*)aString.c_str(),aString.size());
	outputEncoder.Assign(NULL);
	outputFile.CloseFile();

	InputFile inputFile;
	inputFile.OpenFile(BuildRelativeOutputPath(argv,"source.txt"));
	inputDecoder.Assign(inputFile.GetInputStream());

	bool isSame = true;
	int i=0;
	string::iterator it = aString.begin();

	for(; it != aString.end() && isSame;++it,++i)
	{
		LongBufferSizeType amountRead = inputDecoder.Read(&buffer,1);

		if(amountRead != 1)
		{
			cout<<"Read failes. expected "<<1<<" characters. Found"<<amountRead<<"\n";
			isSame = false;
			break;
		}
		isSame = (*it) == buffer;

	}

	inputDecoder.Assign(NULL);
	inputFile.CloseFile();

	if(!isSame)
	{
		cout<<"Read failes. different characters than what expected\n";
		return 1;
	}
	else
		return 0;

}